

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O1

void quantize3_ord_dither
               (j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  JDIMENSION JVar1;
  int iVar2;
  jpeg_color_quantizer *pjVar3;
  _func_void_j_decompress_ptr *p_Var4;
  long lVar5;
  long lVar6;
  long lVar7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_boolean *p_Var9;
  JSAMPROW pJVar10;
  long lVar11;
  ulong uVar12;
  byte *pbVar13;
  long lVar14;
  ulong local_60;
  
  if (0 < num_rows) {
    pjVar3 = cinfo->cquantize;
    p_Var4 = pjVar3[1].finish_pass;
    lVar5 = *(long *)p_Var4;
    lVar6 = *(long *)(p_Var4 + 8);
    lVar7 = *(long *)(p_Var4 + 0x10);
    JVar1 = cinfo->output_width;
    local_60 = 0;
    do {
      iVar2 = *(int *)((long)&pjVar3[2].color_quantize + 4);
      if (JVar1 != 0) {
        lVar14 = (long)iVar2 * 0x40;
        p_Var4 = pjVar3[2].finish_pass;
        p_Var8 = pjVar3[2].new_color_map;
        p_Var9 = pjVar3[3].start_pass;
        pJVar10 = output_buf[local_60];
        pbVar13 = input_buf[local_60];
        lVar11 = 0;
        uVar12 = 0;
        do {
          pJVar10[lVar11] =
               *(char *)(lVar6 + (long)*(int *)(p_Var8 + uVar12 * 4 + lVar14) + (ulong)pbVar13[1]) +
               *(char *)(lVar5 + (long)*(int *)(p_Var4 + uVar12 * 4 + lVar14) + (ulong)*pbVar13) +
               *(char *)(lVar7 + (long)*(int *)(p_Var9 + uVar12 * 4 + lVar14) + (ulong)pbVar13[2]);
          uVar12 = (ulong)((int)uVar12 + 1U & 0xf);
          lVar11 = lVar11 + 1;
          pbVar13 = pbVar13 + 3;
        } while (JVar1 != (JDIMENSION)lVar11);
      }
      *(uint *)((long)&pjVar3[2].color_quantize + 4) = iVar2 + 1U & 0xf;
      local_60 = local_60 + 1;
    } while (local_60 != (uint)num_rows);
  }
  return;
}

Assistant:

METHODDEF(void)
quantize3_ord_dither(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                     JSAMPARRAY output_buf, int num_rows)
/* Fast path for out_color_components==3, with ordered dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  register int pixcode;
  register JSAMPROW input_ptr;
  register JSAMPROW output_ptr;
  JSAMPROW colorindex0 = cquantize->colorindex[0];
  JSAMPROW colorindex1 = cquantize->colorindex[1];
  JSAMPROW colorindex2 = cquantize->colorindex[2];
  int *dither0;                 /* points to active row of dither matrix */
  int *dither1;
  int *dither2;
  int row_index, col_index;     /* current indexes into dither matrix */
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    row_index = cquantize->row_index;
    input_ptr = input_buf[row];
    output_ptr = output_buf[row];
    dither0 = cquantize->odither[0][row_index];
    dither1 = cquantize->odither[1][row_index];
    dither2 = cquantize->odither[2][row_index];
    col_index = 0;

    for (col = width; col > 0; col--) {
      pixcode  = colorindex0[(*input_ptr++) + dither0[col_index]];
      pixcode += colorindex1[(*input_ptr++) + dither1[col_index]];
      pixcode += colorindex2[(*input_ptr++) + dither2[col_index]];
      *output_ptr++ = (JSAMPLE)pixcode;
      col_index = (col_index + 1) & ODITHER_MASK;
    }
    row_index = (row_index + 1) & ODITHER_MASK;
    cquantize->row_index = row_index;
  }
}